

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall MemoryManager::copyMemory(MemoryManager *this,void *src,uint32_t dest,uint32_t len)

{
  bool bVar1;
  uint in_ECX;
  uint32_t in_EDX;
  MemoryManager *in_RSI;
  MemoryManager *in_RDI;
  uint32_t i;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    if (in_ECX <= local_1c) {
      return true;
    }
    bVar1 = addrExist(in_RSI,in_EDX);
    if (!bVar1) break;
    setByte(in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),(uint8_t)((ulong)in_RSI >> 0x18),
            (uint32_t *)CONCAT44(in_EDX,in_ECX));
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"Data Copy Unsuccessfully, invalid addr 0x%x!\n",(ulong)(in_EDX + local_1c));
  exit(-1);
}

Assistant:

bool MemoryManager::copyMemory(void *src, uint32_t dest, uint32_t len) {
    for (uint32_t i = 0; i < len; i++) {
        if (!this->addrExist(dest + i)) {
            fprintf(stderr, "Data Copy Unsuccessfully, invalid addr 0x%x!\n", dest + i);
            exit(-1);
        }
        this->setByte(dest + i, ((uint8_t *) src)[i]);
    }
    return true;
}